

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::Parser::ParseEnumFromString(Parser *this,Type *type,string *result)

{
  uint uVar1;
  size_type sVar2;
  bool bVar3;
  long lVar4;
  const_iterator cVar5;
  long lVar6;
  EnumDef *pEVar7;
  string *in_RCX;
  string *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_def_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> word;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_val_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  unsigned_long local_90;
  Parser *local_88;
  key_type local_80;
  key_type local_60;
  string *local_40;
  ulong local_38;
  
  psVar8 = (string *)((result->field_2)._M_allocated_capacity + 0xd0);
  if ((result->field_2)._M_allocated_capacity == 0) {
    psVar8 = result;
  }
  uVar1 = *(uint *)&(psVar8->_M_dataplus)._M_p;
  local_38 = (ulong)uVar1;
  if (uVar1 - 1 < 10) {
    lVar4 = 0;
    local_90 = 0;
    local_88 = (Parser *)type;
    local_40 = in_RCX;
    do {
      if (lVar4 == -1) {
        if (((uint)local_38 < 0xb) && ((0x552U >> ((uint)local_38 & 0x1f) & 1) != 0)) {
          NumToString<unsigned_long>(&local_80,local_90);
        }
        else {
          NumToString<long>(&local_80,local_90);
        }
        std::__cxx11::string::operator=(local_40,(string *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
        break;
      }
      lVar4 = std::__cxx11::string::find((char)&type[1].struct_def,0x20);
      lVar4 = lVar4 + 1;
      if (lVar4 == 0) {
        lVar4 = -1;
      }
      std::__cxx11::string::substr((ulong)&local_80,(ulong)&type[1].struct_def);
      sVar2 = (result->field_2)._M_allocated_capacity;
      if (sVar2 == 0) {
        lVar6 = std::__cxx11::string::find((char)&local_80,0x2e);
        if (lVar6 == -1) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"enum values need to be qualified by an enum type","");
          Error(this,(string *)local_88);
          goto LAB_001179c5;
        }
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_80);
        pEVar7 = LookupEnum(local_88,&local_b0);
        if (pEVar7 == (EnumDef *)0x0) {
          std::operator+(&local_60,"unknown enum: ",&local_b0);
          Error(this,(string *)local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          lVar6 = 0;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_60,(ulong)&local_80);
          cVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                          *)&pEVar7->vals,&local_60);
          if ((_Rb_tree_header *)cVar5._M_node ==
              &(pEVar7->vals).dict._M_t._M_impl.super__Rb_tree_header) {
            lVar6 = 0;
          }
          else {
            lVar6 = *(long *)(cVar5._M_node + 2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (pEVar7 != (EnumDef *)0x0) goto LAB_00117987;
LAB_001179e1:
        bVar3 = false;
      }
      else {
        cVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                        *)(sVar2 + 0xf0),&local_80);
        if (cVar5._M_node == (_Base_ptr)(sVar2 + 0xf8)) {
LAB_001179a2:
          std::operator+(&local_b0,"unknown enum value: ",&local_80);
          Error(this,(string *)local_88);
LAB_001179c5:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001179e1;
        }
        lVar6 = *(long *)(cVar5._M_node + 2);
LAB_00117987:
        if (lVar6 == 0) goto LAB_001179a2;
        local_90 = local_90 | *(ulong *)(lVar6 + 0xa0);
        bVar3 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    } while (bVar3);
  }
  else {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"not a valid value for this field","");
    Error(this,(string *)type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseEnumFromString(const Type &type,
                                         std::string *result) {
  const auto base_type =
      type.enum_def ? type.enum_def->underlying_type.base_type : type.base_type;
  if (!IsInteger(base_type)) return Error("not a valid value for this field");
  uint64_t u64 = 0;
  for (size_t pos = 0; pos != std::string::npos;) {
    const auto delim = attribute_.find_first_of(' ', pos);
    const auto last = (std::string::npos == delim);
    auto word = attribute_.substr(pos, !last ? delim - pos : std::string::npos);
    pos = !last ? delim + 1 : std::string::npos;
    const EnumVal *ev = nullptr;
    if (type.enum_def) {
      ev = type.enum_def->Lookup(word);
    } else {
      auto dot = word.find_first_of('.');
      if (std::string::npos == dot)
        return Error("enum values need to be qualified by an enum type");
      auto enum_def_str = word.substr(0, dot);
      const auto enum_def = LookupEnum(enum_def_str);
      if (!enum_def) return Error("unknown enum: " + enum_def_str);
      auto enum_val_str = word.substr(dot + 1);
      ev = enum_def->Lookup(enum_val_str);
    }
    if (!ev) return Error("unknown enum value: " + word);
    u64 |= ev->GetAsUInt64();
  }
  *result = IsUnsigned(base_type) ? NumToString(u64)
                                  : NumToString(static_cast<int64_t>(u64));
  return NoError();
}